

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int *piVar1;
  byte bVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Expr *pEVar5;
  Bitmask mPrereq_00;
  WhereLoop *pWVar6;
  u8 uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_EAX;
  sqlite3_index_info *pIdxInfo;
  Select *pSVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ExprList_item *pEVar19;
  WhereTerm *pWVar20;
  ulong uVar21;
  u16 mNoOmit;
  u16 *puVar22;
  WhereClause *pWVar23;
  ushort uVar24;
  SrcList_item *pSVar25;
  uint uVar26;
  long lVar27;
  Parse *pParse;
  ulong uVar28;
  int bIn;
  int local_88;
  uint local_84;
  sqlite3_index_info *local_80;
  undefined8 local_78;
  SrcList_item *local_70;
  uint local_64;
  Bitmask local_60;
  WhereLoopBuilder *local_58;
  WhereClause *local_50;
  Parse *local_48;
  WhereLoop *local_40;
  uint local_34;
  
  local_50 = pBuilder->pWC;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_40 = pBuilder->pNew;
  bVar2 = local_40->iTab;
  local_70 = pSVar3->a + bVar2;
  pEVar4 = pBuilder->pOrderBy;
  iVar14 = local_50->nTerm;
  iVar9 = 0;
  if (0 < iVar14) {
    puVar22 = &local_50->a->eOperator;
    iVar9 = 0;
    do {
      if ((*(int *)(puVar22 + 4) == pSVar3->a[bVar2].iCursor) &&
         ((*(ulong *)(puVar22 + 0xe) & mUnusable) == 0)) {
        iVar9 = (iVar9 + 1) - (uint)((*puVar22 & 0xf7ff) == 0);
      }
      puVar22 = puVar22 + 0x20;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  pParse = pBuilder->pWInfo->pParse;
  uVar26 = 0;
  if (pEVar4 != (ExprList *)0x0) {
    uVar13 = pEVar4->nExpr;
    uVar15 = 0;
    if (0 < (int)uVar13) {
      pEVar19 = pEVar4->a;
      uVar15 = 0;
      do {
        if ((pEVar19->pExpr->op != 0xa2) || (pEVar19->pExpr->iTable != pSVar3->a[bVar2].iCursor))
        goto LAB_0018b945;
        uVar15 = uVar15 + 1;
        pEVar19 = pEVar19 + 1;
      } while (uVar13 != uVar15);
      uVar15 = (ulong)uVar13;
    }
LAB_0018b945:
    uVar26 = 0;
    if ((uint)uVar15 == uVar13) {
      uVar26 = uVar13;
    }
  }
  lVar27 = (long)iVar9;
  local_80 = (sqlite3_index_info *)CONCAT44(local_80._4_4_,uVar26);
  local_58 = pBuilder;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pParse->db,(long)(int)uVar26 * 8 + lVar27 * 0x14 + 0x70);
  local_60 = mPrereq;
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    pIdxInfo = (sqlite3_index_info *)0x0;
    sqlite3ErrorMsg(pParse,"out of memory");
    local_78 = CONCAT44(local_78._4_4_,extraout_EAX);
  }
  else {
    local_48 = (Parse *)(lVar27 * 3);
    pIdxInfo->nConstraint = iVar9;
    pIdxInfo->nOrderBy = uVar26;
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)&pIdxInfo[1].nOrderBy;
    pIdxInfo->aOrderBy = (sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3);
    pIdxInfo->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&pIdxInfo[1].nOrderBy + lVar27 * 3) + (int)uVar26);
    *(WhereClause **)(pIdxInfo + 1) = local_50;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    uVar26 = local_50->nTerm;
    if ((int)uVar26 < 1) {
      local_78 = (ulong)local_78._4_4_ << 0x20;
    }
    else {
      pWVar20 = local_50->a;
      iVar14 = local_70->iCursor;
      uVar13 = 0;
      iVar9 = 0;
      local_78 = (ulong)local_78._4_4_ << 0x20;
      do {
        if ((((pWVar20->leftCursor == iVar14) && ((pWVar20->prereqRight & mUnusable) == 0)) &&
            (uVar24 = pWVar20->eOperator, (uVar24 & 0xf7ff) != 0)) &&
           (((((local_70->fg).jointype & 8) == 0 || ((uVar24 & 0x180) == 0)) ||
            ((pWVar20->pExpr->flags & 1) != 0)))) {
          piVar1 = &pIdxInfo[1].nOrderBy + (long)iVar9 * 3;
          *piVar1 = (pWVar20->u).leftColumn;
          piVar1[2] = uVar13;
          uVar24 = uVar24 & 0x1fff;
          uVar8 = uVar24;
          if (uVar24 == 1) {
            uVar8 = 2;
          }
          if (uVar8 == 0x40) {
            uVar7 = pWVar20->eMatchOp;
LAB_0018ba72:
            *(u8 *)(piVar1 + 1) = uVar7;
          }
          else {
            if ((uVar8 & 0x180) != 0) {
              uVar7 = 'H' - (uVar8 == 0x100);
              goto LAB_0018ba72;
            }
            *(char *)(piVar1 + 1) = (char)uVar8;
            if ((uVar8 & 0x3c) != 0) {
              pEVar5 = pWVar20->pExpr->pRight;
              uVar7 = pEVar5->op;
              if (uVar7 == 0xa8) {
                uVar7 = pEVar5->op2;
              }
              if (uVar7 == 0x83) {
                pSVar11 = (pEVar5->x).pSelect;
              }
              else {
                if (uVar7 != 0xa9) goto LAB_0018ba75;
                pSVar11 = (Select *)&pEVar5->x;
              }
              if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar11->pEList)->pList->nExpr) {
                uVar10 = 1 << ((byte)uVar13 & 0x1f);
                if (0xf < uVar13) {
                  uVar10 = 0;
                }
                local_78 = CONCAT44(local_78._4_4_,(uint)local_78 | uVar10);
                if (uVar24 == 0x10) {
                  uVar7 = '\b';
                }
                else {
                  if (uVar24 != 4) goto LAB_0018ba75;
                  uVar7 = ' ';
                }
                goto LAB_0018ba72;
              }
            }
          }
LAB_0018ba75:
          iVar9 = iVar9 + 1;
        }
        uVar13 = uVar13 + 1;
        pWVar20 = pWVar20 + 1;
      } while (uVar26 != uVar13);
    }
    if (0 < (int)local_80) {
      lVar16 = 0;
      do {
        *(int *)((long)&pIdxInfo[1].nOrderBy + lVar16 + lVar27 * 0xc) =
             (int)*(short *)(*(long *)((long)&pEVar4->a[0].pExpr + lVar16 * 4) + 0x30);
        (&pIdxInfo[1].field_0x14)[lVar16 + lVar27 * 0xc] = (&pEVar4->a[0].sortOrder)[lVar16 * 4];
        lVar16 = lVar16 + 8;
      } while (((ulong)local_80 & 0xffffffff) << 3 != lVar16);
    }
  }
  pWVar6 = local_40;
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    iVar14 = 7;
  }
  else {
    local_40->rSetup = 0;
    local_40->wsFlags = 0x400;
    local_40->nLTerm = 0;
    (local_40->u).vtab.needFree = '\0';
    uVar26 = pIdxInfo->nConstraint;
    iVar9 = whereLoopResize(pParse->db,local_40,uVar26);
    iVar14 = 7;
    if (iVar9 == 0) {
      uVar24 = (ushort)local_78;
      uVar13 = (uint)(ushort)local_78;
      local_80 = pIdxInfo;
      local_70 = (SrcList_item *)(ulong)uVar26;
      local_48 = pParse;
      iVar14 = whereLoopAddVirtualOne
                         (local_58,local_60,0xffffffffffffffff,0,pIdxInfo,(ushort)local_78,&local_88
                         );
      if (iVar14 == 0) {
        uVar28 = ~local_60;
        uVar15 = pWVar6->prereq & uVar28;
        iVar14 = 0;
        if (local_88 != 0 || uVar15 != 0) {
          local_64 = uVar13;
          if (local_88 == 0) {
            iVar14 = 0;
            uVar26 = 0;
            local_78 = 0;
          }
          else {
            iVar14 = whereLoopAddVirtualOne
                               (local_58,local_60,0xffffffffffffffff,1,local_80,uVar24,&local_88);
            local_78 = pWVar6->prereq & uVar28;
            uVar26 = (uint)(local_78 == 0);
          }
          mPrereq_00 = local_60;
          lVar27 = (long)local_70 * 0xc;
          uVar17 = 0;
          pWVar23 = local_50;
          pSVar25 = local_70;
          local_84 = uVar26;
          do {
            if (iVar14 != 0) break;
            if ((int)pSVar25 < 1) {
              uVar12 = 0xffffffffffffffff;
            }
            else {
              uVar12 = 0xffffffffffffffff;
              lVar16 = 0;
              do {
                uVar18 = pWVar23->a[*(int *)((long)&local_80->aConstraint->iTermOffset + lVar16)].
                         prereqRight & uVar28;
                uVar21 = uVar12;
                if (uVar18 < uVar12) {
                  uVar21 = uVar18;
                }
                if (uVar17 < uVar18) {
                  uVar12 = uVar21;
                }
                lVar16 = lVar16 + 0xc;
              } while (lVar27 != lVar16);
            }
            iVar14 = 0;
            if (((uVar12 != 0xffffffffffffffff) && (uVar12 != uVar15)) &&
               ((iVar14 = 0, uVar12 != local_78 &&
                ((local_34 = uVar26,
                 iVar14 = whereLoopAddVirtualOne
                                    (local_58,mPrereq_00,uVar12 | mPrereq_00,0,local_80,
                                     (u16)local_64,&local_88), pWVar23 = local_50,
                 pSVar25 = local_70, uVar26 = local_34, local_40->prereq == mPrereq_00 &&
                 (uVar26 = 1, local_88 == 0)))))) {
              local_84 = 1;
            }
            uVar17 = uVar12;
          } while (uVar12 != 0xffffffffffffffff);
          mNoOmit = (u16)local_64;
          uVar13 = local_84;
          if (uVar26 == 0 && iVar14 == 0) {
            iVar14 = whereLoopAddVirtualOne(local_58,local_60,local_60,0,local_80,mNoOmit,&local_88)
            ;
            uVar13 = local_84;
            if (local_88 == 0) {
              uVar13 = 1;
            }
          }
          if (uVar13 == 0 && iVar14 == 0) {
            iVar14 = whereLoopAddVirtualOne(local_58,local_60,local_60,1,local_80,mNoOmit,&local_88)
            ;
          }
        }
      }
      pIdxInfo = local_80;
      pParse = local_48;
      if (local_80->needToFreeIdxStr != 0) {
        sqlite3_free(local_80->idxStr);
        pParse = local_48;
      }
    }
    sqlite3DbFreeNN(pParse->db,pIdxInfo);
  }
  return iVar14;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making 
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}